

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

bool __thiscall minihttp::HttpSocket::_Redirect(HttpSocket *this,string *loc,bool forceGET)

{
  string *host;
  bool bVar1;
  undefined1 local_f8 [128];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int local_58 [2];
  void *local_50;
  bool local_48 [8];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  if (loc->_M_string_length == 0) {
    bVar1 = false;
  }
  else {
    local_f8._0_8_ = local_f8 + 0x10;
    local_f8._8_8_ = 0;
    local_f8[0x10] = '\0';
    local_f8._32_8_ = local_f8 + 0x30;
    local_f8._40_8_ = 0;
    local_f8[0x30] = '\0';
    local_f8._64_8_ = local_f8 + 0x50;
    local_f8._72_8_ = 0;
    local_f8[0x50] = '\0';
    local_f8._96_8_ = local_f8 + 0x70;
    local_f8._104_8_ = 0;
    local_f8[0x70] = '\0';
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_58[0] = 0x50;
    local_40._M_p = (pointer)&local_30;
    local_38 = 0;
    local_30._M_local_buf[0] = '\0';
    local_50 = (this->_curRequest).user;
    local_48[0] = (this->_curRequest).useSSL;
    if (!forceGET) {
      std::__cxx11::string::_M_assign((string *)&local_40);
    }
    host = (string *)(local_f8 + 0x20);
    SplitURI(loc,(string *)local_f8,host,(string *)(local_f8 + 0x60),local_58,local_48);
    if (local_f8._8_8_ == 0) {
      std::__cxx11::string::_M_assign((string *)host);
      std::__cxx11::string::_M_assign((string *)(local_f8 + 0x60));
    }
    if (local_f8._40_8_ == 0) {
      std::__cxx11::string::_M_assign((string *)host);
    }
    if (local_58[0] < 0) {
      local_58[0] = (this->_curRequest).port;
    }
    std::__cxx11::string::_M_assign((string *)&local_78);
    bVar1 = SendRequest(this,(Request *)local_f8,false);
    Request::~Request((Request *)local_f8);
  }
  return bVar1;
}

Assistant:

void HttpSocket::_FinishRequest(void)
{
    traceprint("HttpSocket::_FinishRequest\n");
    if(_inProgress)
    {
        traceprint("... in progress. redirecting = %d\n", IsRedirecting());
        if(!IsRedirecting() || _alwaysHandle)
            _OnRequestDone(); // notify about finished request
        _inProgress = false;
        _hdrs.clear();
        if(_mustClose)
            close();
    }
}